

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosRangeFilter.cpp
# Opt level: O3

size_t __thiscall adios2::helper::RangeFilter::ToSizeT(RangeFilter *this,string *input)

{
  uint uVar1;
  char *__nptr;
  uint *puVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 uVar6;
  size_type *psVar7;
  ulong uVar8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __nptr = (input->_M_dataplus)._M_p;
  puVar2 = (uint *)__errno_location();
  uVar1 = *puVar2;
  *puVar2 = 0;
  pcVar3 = (pointer)strtol(__nptr,(char **)&local_b0,10);
  uVar8 = (long)local_b0._M_dataplus._M_p - (long)__nptr;
  if (local_b0._M_dataplus._M_p == __nptr) {
    std::__throw_invalid_argument("stol");
  }
  else if (*puVar2 != 0x22) {
    if (*puVar2 == 0) {
      *puVar2 = uVar1;
    }
    if ((long)pcVar3 < 0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Helper","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"adiosRangeFilter","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ToSizeT","");
      std::operator+(&local_50,"Negative number \'",input);
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      psVar7 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_d0.field_2._M_allocated_capacity = *psVar7;
        local_d0.field_2._8_8_ = puVar4[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar7;
        local_d0._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_d0._M_string_length = puVar4[1];
      *puVar4 = psVar7;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      ThrowNested<std::invalid_argument>(&local_b0,&local_70,&local_90,&local_d0,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    if (uVar8 < input->_M_string_length) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Helper","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"adiosRangeFilter","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ToSizeT","");
      std::operator+(&local_50,"could not cast the entire string \'",input);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_d0.field_2._M_allocated_capacity = *psVar7;
        local_d0.field_2._8_8_ = plVar5[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar7;
        local_d0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_d0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ThrowNested<std::invalid_argument>(&local_b0,&local_70,&local_90,&local_d0,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    return (size_t)pcVar3;
  }
  uVar6 = std::__throw_out_of_range("stol");
  if ((uint *)local_d0._M_dataplus._M_p != puVar2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_90._M_dataplus._M_p != pcVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_70._M_dataplus._M_p != (pointer)(ulong)uVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_b0._M_dataplus._M_p != __nptr) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

size_t RangeFilter::ToSizeT(const std::string &input)
{
    long value;
    size_t pos;
    try
    {
        value = std::stol(input, &pos);
    }
    catch (...)
    {
        helper::ThrowNested<std::invalid_argument>("Helper", "adiosRangeFilter", "ToSizeT",
                                                   "could not cast string '" + input +
                                                       "' to number ");
    }
    if (value < 0L)
    {
        helper::ThrowNested<std::invalid_argument>("Helper", "adiosRangeFilter", "ToSizeT",
                                                   "Negative number '" + input +
                                                       "' not supported in range selections!");
    }
    if (pos < input.size())
    {
        helper::ThrowNested<std::invalid_argument>(
            "Helper", "adiosRangeFilter", "ToSizeT",
            "could not cast the entire string '" + input +
                "' to a single integer number. RangeFilter accepts a "
                "space-separated list of i:j:k expressions where i,j,k are "
                "non-negative integers or the character 'n'");
    }
    return static_cast<size_t>(value);
}